

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SStream.c
# Opt level: O1

void printInt32(SStream *O,int32_t val)

{
  ulong uVar1;
  char *fmt;
  
  uVar1 = (ulong)(uint)val;
  if (val < 0) {
    if (val < -9) {
      fmt = "-0x%x";
      uVar1 = (ulong)(uint)-val;
    }
    else {
      uVar1 = (ulong)(uint)-val;
      fmt = "-%u";
    }
  }
  else if (val < 10) {
    fmt = "%u";
  }
  else {
    fmt = "0x%x";
  }
  SStream_concat(O,fmt,uVar1);
  return;
}

Assistant:

void printInt32(SStream *O, int32_t val)
{
	if (val >= 0) {
		if (val > HEX_THRESHOLD)
			SStream_concat(O, "0x%x", val);
		else
			SStream_concat(O, "%u", val);
	} else {
		if (val <- HEX_THRESHOLD) {
			if (val == INT_MIN)
				SStream_concat(O, "-0x%x", (uint32_t)val);
			else
				SStream_concat(O, "-0x%x", (uint32_t)-val);
			}
		else
			SStream_concat(O, "-%u", -val);
	}
}